

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

kp_error_t list_dir_r(char ***safes,int *nsafes,char *root)

{
  long lVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  int *in_RDX;
  char ***in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  dirent *dirent;
  DIR *dirp;
  kp_error_t ret;
  char path [4096];
  undefined4 in_stack_ffffffffffffefd0;
  kp_error_t kVar7;
  char local_1008 [144];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  kVar7 = 0;
  __dirp = opendir((char *)in_RDX);
  if (__dirp == (DIR *)0x0) {
    kVar7 = 5;
    kp_warn(5,"cannot open dir %s",in_RDX);
  }
  else {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      if ((pdVar2->d_name[0] != '.') && ((pdVar2->d_type == '\b' || (pdVar2->d_type == '\x04')))) {
        uVar3 = strlcpy(local_1008,in_RDX,0x1000);
        if (0xfff < uVar3) {
          piVar4 = __errno_location();
          *piVar4 = 0xc;
          kVar7 = 5;
          kp_warn(5,"memory error");
          break;
        }
        uVar3 = strlcat(local_1008,"/",0x1000);
        if (0xfff < uVar3) {
          piVar4 = __errno_location();
          *piVar4 = 0xc;
          kVar7 = 5;
          kp_warn(5,"memory error");
          break;
        }
        uVar3 = strlcat(local_1008,pdVar2->d_name,0x1000);
        if (0xfff < uVar3) {
          piVar4 = __errno_location();
          *piVar4 = 0xc;
          kVar7 = 5;
          kp_warn(5,"memory error");
          break;
        }
        if (pdVar2->d_type == '\x04') {
          kVar7 = list_dir_r(in_RSI,in_RDX,(char *)CONCAT44(kVar7,in_stack_ffffffffffffefd0));
        }
        else if (pdVar2->d_type == '\b') {
          lVar5 = reallocarray(*in_RDI,(long)(*(int *)in_RSI + 1),8);
          *in_RDI = lVar5;
          if (lVar5 == 0) {
            piVar4 = __errno_location();
            *piVar4 = 0xc;
            kVar7 = 5;
            kp_warn(5,"memory error");
            break;
          }
          pcVar6 = strndup(local_1008,0x1000);
          *(char **)(*in_RDI + (long)*(int *)in_RSI * 8) = pcVar6;
          if (*(long *)(*in_RDI + (long)*(int *)in_RSI * 8) == 0) {
            piVar4 = __errno_location();
            *piVar4 = 0xc;
            kVar7 = 5;
            kp_warn(5,"memory error");
            break;
          }
          *(int *)in_RSI = *(int *)in_RSI + 1;
        }
      }
    }
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return kVar7;
}

Assistant:

static kp_error_t
list_dir_r(char ***safes, int *nsafes, char *root)
{
	kp_error_t ret = KP_SUCCESS;
	DIR *dirp;
	struct dirent *dirent;

	if ((dirp = opendir(root)) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot open dir %s", root);
		return ret;
	}

	while ((dirent = readdir(dirp)) != NULL) {
		char path[PATH_MAX];
		if (dirent->d_name[0] == '.'
				|| (dirent->d_type != DT_REG
				&& dirent->d_type != DT_DIR)) {
			continue;
		}

		if (strlcpy(path, root, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, "/", PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (strlcat(path, dirent->d_name, PATH_MAX) >= PATH_MAX) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		switch (dirent->d_type) {
		case DT_REG:
			if ((*safes = reallocarray(*safes, *nsafes + 1, sizeof(char *)))
					== NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*safes)[*nsafes] = strndup(path, PATH_MAX);
			if ((*safes)[*nsafes] == NULL) {
				errno = ENOMEM;
				ret = KP_ERRNO;
				kp_warn(ret, "memory error");
				goto out;
			}

			(*nsafes)++;
			break;
		case DT_DIR:
			ret = list_dir_r(safes, nsafes, path);
		}
	}

out:
	closedir(dirp);

	return ret;
}